

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O2

void mp_reduce_mod_2to(mp_int *x,size_t p)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar2 = ~(-1L << ((byte)p & 0x3f));
  uVar1 = x->nw;
  for (uVar3 = p >> 6; uVar3 < uVar1; uVar3 = uVar3 + 1) {
    x->w[uVar3] = x->w[uVar3] & uVar2;
    uVar2 = 0;
  }
  return;
}

Assistant:

void mp_reduce_mod_2to(mp_int *x, size_t p)
{
    size_t word = p / BIGNUM_INT_BITS;
    size_t mask = ((size_t)1 << (p % BIGNUM_INT_BITS)) - 1;
    for (; word < x->nw; word++) {
        x->w[word] &= mask;
        mask = 0;
    }
}